

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void __thiscall
kj::UnixEventPort::SignalPromiseAdapter::~SignalPromiseAdapter(SignalPromiseAdapter *this)

{
  SignalPromiseAdapter *this_local;
  
  if (this->prev != (SignalPromiseAdapter **)0x0) {
    if (this->next == (SignalPromiseAdapter *)0x0) {
      this->loop->signalTail = this->prev;
    }
    else {
      this->next->prev = this->prev;
    }
    *this->prev = this->next;
  }
  return;
}

Assistant:

~SignalPromiseAdapter() noexcept(false) {
    if (prev != nullptr) {
      if (next == nullptr) {
        loop.signalTail = prev;
      } else {
        next->prev = prev;
      }
      *prev = next;
    }
  }